

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveUnusedBrs.cpp
# Opt level: O1

void wasm::RemoveUnusedBrs::visitAny(RemoveUnusedBrs *self,Expression **currp)

{
  size_t *this;
  Flows *this_00;
  pointer *ppppEVar1;
  Id IVar2;
  Switch *curr;
  size_t sVar3;
  Expression **ppEVar4;
  Expression *pEVar5;
  pointer pppEVar6;
  iterator iVar7;
  pointer pvVar8;
  MixedArena *pMVar9;
  __normal_iterator<wasm::Expression_***,_std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>_>
  _Var10;
  int iVar11;
  uint uVar12;
  MixedArena *pMVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  Nop *output;
  Expression ***pppEVar17;
  iterator __end6;
  __normal_iterator<wasm::Expression_***,_std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>_>
  _Var18;
  Expression **local_50;
  Expression **flow;
  Expression **currp_local;
  Expression ***local_38;
  
  curr = (Switch *)*currp;
  this_00 = &self->flows;
  IVar2 = (curr->super_SpecificExpression<(wasm::Expression::Id)5>).super_Expression._id;
  flow = currp;
  if (DropId < IVar2) {
    if (IVar2 == ReturnId) {
      pppEVar6 = (self->flows).
                 super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      if ((self->flows).
          super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl.
          super__Vector_impl_data._M_finish != pppEVar6) {
        (self->flows).super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
        _M_impl.super__Vector_impl_data._M_finish = pppEVar6;
      }
      goto LAB_00a90682;
    }
    if (IVar2 == NopId) goto LAB_00a9082a;
    if (IVar2 == TryTableId) {
      return;
    }
    goto switchD_00a90546_default;
  }
  switch(IVar2) {
  case BlockId:
    sVar3 = (curr->targets).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.usedElements;
    if (sVar3 != 0) {
      uVar15 = (ulong)((long)(self->flows).
                             super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(self->flows).
                            super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 3;
      iVar14 = (int)uVar15;
      if (iVar14 == 0) {
        iVar11 = 0;
      }
      else {
        uVar16 = 0;
        iVar11 = 0;
        do {
          pppEVar6 = (this_00->
                     super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>).
                     _M_impl.super__Vector_impl_data._M_start;
          ppEVar4 = pppEVar6[uVar16];
          pEVar5 = *ppEVar4;
          if ((pEVar5->_id == BreakId) && (pEVar5[1].type.id == sVar3)) {
            if (*(Expression **)(pEVar5 + 2) == (Expression *)0x0) {
              pEVar5->_id = NopId;
              (pEVar5->type).id = 0;
            }
            else {
              *ppEVar4 = *(Expression **)(pEVar5 + 2);
            }
            iVar11 = iVar11 + 1;
            self->anotherCycle = true;
          }
          else if (iVar11 == 0) {
            iVar11 = 0;
          }
          else {
            pppEVar6[(uint)((int)uVar16 - iVar11)] = ppEVar4;
          }
          uVar16 = uVar16 + 1;
        } while ((uVar15 & 0xffffffff) != uVar16);
      }
      if (iVar11 != 0) {
        std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>::resize
                  (this_00,(ulong)(uint)(iVar14 - iVar11));
      }
    }
    this = &(curr->targets).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.
            allocatedElements;
    while ((pMVar9 = (curr->targets).allocator, pMVar9 != (MixedArena *)0x0 &&
           (**(char **)(*this + (long)((long)&pMVar9[-1].next._M_b._M_p + 7) * 8) == '\x16'))) {
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::resize
                ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)this,
                 (size_t)((long)&pMVar9[-1].next._M_b._M_p + 7));
      self->anotherCycle = true;
    }
    if (pMVar9 != (MixedArena *)0x0) {
      uVar12 = 1;
      pMVar13 = (MixedArena *)0x0;
      do {
        if (((MixedArena *)((long)&pMVar9[-1].next._M_b._M_p + 7) != pMVar13) &&
           (*(long *)(*(long *)(*this + (long)pMVar13 * 8) + 8) == 1)) goto LAB_00a9082a;
        pMVar13 = (MixedArena *)(ulong)uVar12;
        uVar12 = uVar12 + 1;
      } while (pMVar13 < pMVar9);
    }
    break;
  case IfId:
    if ((((curr->targets).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.data)->
        super_IString).str._M_str != (char *)0x1) {
      if ((curr->targets).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.
          allocatedElements != 0) {
        pvVar8 = (self->ifStack).
                 super__Vector_base<std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>,_std::allocator<std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pvVar8 == (self->ifStack).
                      super__Vector_base<std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>,_std::allocator<std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) {
          __assert_fail("self->ifStack.size() > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/RemoveUnusedBrs.cpp"
                        ,0xc4,
                        "static void wasm::RemoveUnusedBrs::visitAny(RemoveUnusedBrs *, Expression **)"
                       );
        }
        pppEVar17 = pvVar8[-1].
                    super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        _Var18._M_current =
             pvVar8[-1].
             super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl.
             super__Vector_impl_data._M_finish;
        currp_local = (Expression **)
                      pvVar8[-1].
                      super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage;
        pvVar8[-1].super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        pvVar8[-1].super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        pvVar8[-1].super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pvVar8 = (self->ifStack).
                 super__Vector_base<std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>,_std::allocator<std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        (self->ifStack).
        super__Vector_base<std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>,_std::allocator<std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = pvVar8 + -1;
        pppEVar6 = pvVar8[-1].
                   super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        if (pppEVar6 != (pointer)0x0) {
          operator_delete(pppEVar6,(long)pvVar8[-1].
                                         super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                   (long)pppEVar6);
        }
        local_38 = pppEVar17;
        if ((*(long *)((curr->targets).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.
                       usedElements + 8) == 0) ||
           (*(long *)((curr->targets).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.
                      allocatedElements + 8) == 0)) {
          _Var10 = std::
                   __remove_if<__gnu_cxx::__normal_iterator<wasm::Expression***,std::vector<wasm::Expression**,std::allocator<wasm::Expression**>>>,__gnu_cxx::__ops::_Iter_pred<wasm::RemoveUnusedBrs::removeValueFlow(std::vector<wasm::Expression**,std::allocator<wasm::Expression**>>&)::_lambda(wasm::Expression**)_1_>>
                             (pppEVar17,_Var18._M_current);
          if (_Var10._M_current != _Var18._M_current) {
            _Var18 = _Var10;
          }
          removeValueFlow(self,this_00);
        }
        if (pppEVar17 != _Var18._M_current) {
          pppEVar17 = local_38;
          do {
            local_50 = *pppEVar17;
            iVar7._M_current =
                 (self->flows).
                 super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            if (iVar7._M_current ==
                (self->flows).
                super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<wasm::Expression**,std::allocator<wasm::Expression**>>::
              _M_realloc_insert<wasm::Expression**const&>
                        ((vector<wasm::Expression**,std::allocator<wasm::Expression**>> *)this_00,
                         iVar7,&local_50);
            }
            else {
              *iVar7._M_current = local_50;
              ppppEVar1 = &(self->flows).
                           super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
              *ppppEVar1 = *ppppEVar1 + 1;
            }
            pppEVar17 = pppEVar17 + 1;
          } while (pppEVar17 != _Var18._M_current);
        }
        if (local_38 == (Expression ***)0x0) {
          return;
        }
        operator_delete(local_38,(long)currp_local - (long)local_38);
        return;
      }
LAB_00a9082a:
      removeValueFlow(self,this_00);
      return;
    }
  default:
switchD_00a90546_default:
    pppEVar6 = (self->flows).
               super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl
               .super__Vector_impl_data._M_start;
    if ((self->flows).super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
        _M_impl.super__Vector_impl_data._M_finish != pppEVar6) {
      (self->flows).super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
      _M_impl.super__Vector_impl_data._M_finish = pppEVar6;
    }
    break;
  case LoopId:
    break;
  case BreakId:
    pppEVar6 = (self->flows).
               super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl
               .super__Vector_impl_data._M_start;
    if ((self->flows).super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
        _M_impl.super__Vector_impl_data._M_finish != pppEVar6) {
      (self->flows).super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
      _M_impl.super__Vector_impl_data._M_finish = pppEVar6;
    }
    if ((curr->targets).allocator != (MixedArena *)0x0) goto LAB_00a9082a;
LAB_00a90682:
    iVar7._M_current =
         (self->flows).super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar7._M_current ==
        (self->flows).super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<wasm::Expression**,std::allocator<wasm::Expression**>>::
      _M_realloc_insert<wasm::Expression**const&>
                ((vector<wasm::Expression**,std::allocator<wasm::Expression**>> *)this_00,iVar7,
                 &flow);
    }
    else {
      *iVar7._M_current = currp;
      ppppEVar1 = &(self->flows).
                   super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
      *ppppEVar1 = *ppppEVar1 + 1;
    }
    break;
  case SwitchId:
    pppEVar6 = (self->flows).
               super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl
               .super__Vector_impl_data._M_start;
    if ((self->flows).super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
        _M_impl.super__Vector_impl_data._M_finish != pppEVar6) {
      (self->flows).super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
      _M_impl.super__Vector_impl_data._M_finish = pppEVar6;
    }
    optimizeSwitch(self,curr);
    return;
  }
  return;
}

Assistant:

static void visitAny(RemoveUnusedBrs* self, Expression** currp) {
    auto* curr = *currp;
    auto& flows = self->flows;

    if (curr->is<Break>()) {
      flows.clear();
      auto* br = curr->cast<Break>();
      if (!br->condition) { // TODO: optimize?
        // a break, let's see where it flows to
        flows.push_back(currp);
      } else {
        self->stopValueFlow();
      }
    } else if (curr->is<Return>()) {
      flows.clear();
      flows.push_back(currp);
    } else if (curr->is<If>()) {
      auto* iff = curr->cast<If>();
      if (iff->condition->type == Type::unreachable) {
        // avoid trying to optimize this, we never reach it anyhow
        self->stopFlow();
        return;
      }
      if (iff->ifFalse) {
        assert(self->ifStack.size() > 0);
        auto ifTrueFlows = std::move(self->ifStack.back());
        self->ifStack.pop_back();
        // we can flow values out in most cases, except if one arm
        // has the none type - we will update the types later, but
        // there is no way to emit a proper type for one arm being
        // none and the other flowing a value; and there is no way
        // to flow a value from a none.
        if (iff->ifTrue->type == Type::none ||
            iff->ifFalse->type == Type::none) {
          self->removeValueFlow(ifTrueFlows);
          self->stopValueFlow();
        }
        for (auto* flow : ifTrueFlows) {
          flows.push_back(flow);
        }
      } else {
        // if without else stops the flow of values
        self->stopValueFlow();
      }
    } else if (auto* block = curr->dynCast<Block>()) {
      // any breaks flowing to here are unnecessary, as we get here anyhow
      auto name = block->name;
      auto& list = block->list;
      if (name.is()) {
        Index size = flows.size();
        Index skip = 0;
        for (Index i = 0; i < size; i++) {
          auto* flow = (*flows[i])->dynCast<Break>();
          if (flow && flow->name == name) {
            if (!flow->value) {
              // br => nop
              ExpressionManipulator::nop<Break>(flow);
            } else {
              // br with value => value
              *flows[i] = flow->value;
            }
            skip++;
            self->anotherCycle = true;
          } else if (skip > 0) {
            flows[i - skip] = flows[i];
          }
        }
        if (skip > 0) {
          flows.resize(size - skip);
        }
      }
      // Drop a nop at the end of a block, which prevents a value flowing. Note
      // that this is worth doing regardless of whether we have a name on this
      // block or not (which the if right above us checks) - such a nop is
      // always unneeded and can limit later optimizations.
      while (list.size() > 0 && list.back()->is<Nop>()) {
        list.resize(list.size() - 1);
        self->anotherCycle = true;
      }
      // A value flowing is only valid if it is a value that the block actually
      // flows out. If it is never reached, it does not flow out, and may be
      // invalid to represent as such.
      auto size = list.size();
      for (Index i = 0; i < size; i++) {
        if (i != size - 1 && list[i]->type == Type::unreachable) {
          // No value flows out of this block.
          self->stopValueFlow();
          break;
        }
      }
    } else if (curr->is<Nop>()) {
      // Ignore (could be result of a previous cycle).
      self->stopValueFlow();
    } else if (curr->is<Loop>() || curr->is<TryTable>()) {
      // Do nothing - it's ok for values to flow out.
      // TODO: Legacy Try as well?
    } else if (auto* sw = curr->dynCast<Switch>()) {
      self->stopFlow();
      self->optimizeSwitch(sw);
    } else {
      // Anything else stops the flow.
      self->stopFlow();
    }
  }